

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  uint uVar5;
  TCGv_i64 pTVar6;
  MemOp_conflict memop;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = (s->fields).presentO;
  if (((uVar7 & 1) != 0) && ((uVar7 & 4) != 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar7 = (s->fields).c[0];
    uVar8 = (ulong)(int)uVar7;
    uVar1 = (s->fields).c[2];
    iVar2 = (int)s->insn->data;
    pTVar6 = tcg_const_i64_s390x(tcg_ctx,(long)iVar2);
    pTVar3 = tcg_ctx->regs[uVar8];
    pTVar4 = o->in2;
    uVar5 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
    memop = iVar2 == 8 | MO_BEUL;
    tcg_gen_qemu_st_i64_s390x(tcg_ctx,pTVar3,pTVar4,(ulong)uVar5,memop);
    while (uVar7 != uVar1) {
      tcg_gen_op3_s390x(tcg_ctx,INDEX_op_add_i64,(TCGArg)(o->in2 + (long)tcg_ctx),
                        (TCGArg)(o->in2 + (long)tcg_ctx),(TCGArg)(pTVar6 + (long)tcg_ctx));
      uVar7 = (int)uVar8 + 1U & 0xf;
      uVar8 = (ulong)uVar7;
      pTVar3 = tcg_ctx->regs[uVar8];
      pTVar4 = o->in2;
      uVar5 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx,pTVar3,pTVar4,(ulong)uVar5,memop);
    }
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static bool op_stm(DisasContext *s, arg_ldst_block *a, int min_n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int i, j, n, list, mem_idx;
    bool user = a->u;
    TCGv_i32 addr, tmp, tmp2;

    if (user) {
        /* STM (user) */
        if (IS_USER(s)) {
            /* Only usable in supervisor mode.  */
            unallocated_encoding(s);
            return true;
        }
    }

    list = a->list;
    n = ctpop16(list);
    if (n < min_n || a->rn == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = op_addr_block_pre(s, a, n);
    mem_idx = get_mem_index(s);

    for (i = j = 0; i < 16; i++) {
        if (!(list & (1 << i))) {
            continue;
        }

        if (user && i != 15) {
            tmp = tcg_temp_new_i32(tcg_ctx);
            tmp2 = tcg_const_i32(tcg_ctx, i);
            gen_helper_get_user_reg(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp2);
            tcg_temp_free_i32(tcg_ctx, tmp2);
        } else {
            tmp = load_reg(s, i);
        }
        gen_aa32_st32(s, tmp, addr, mem_idx);
        tcg_temp_free_i32(tcg_ctx, tmp);

        /* No need to add after the last transfer.  */
        if (++j != n) {
            tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
        }
    }

    op_addr_block_post(s, a, addr, n);
    return true;
}